

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

double solve_problem(int nx,int nt)

{
  size_type __n;
  reference pvVar1;
  double dVar2;
  double error;
  undefined1 local_d8 [8];
  vec b;
  undefined1 local_b8 [4];
  int i_1;
  TridiagonalMatrix m;
  int i;
  double tau;
  double h;
  allocator<double> local_39;
  value_type_conflict local_38;
  undefined1 local_30 [8];
  vec current_layer;
  int size;
  int nt_local;
  int nx_local;
  
  current_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = compute_linear_system_size(nx + -1);
  __n = (size_type)
        current_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,__n,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  for (m._76_4_ = 0; (int)m._76_4_ < nx + -1; m._76_4_ = m._76_4_ + 1) {
    dVar2 = exact_solution((0.7853981633974483 / (double)nx) * (double)(m._76_4_ + 1),0.0);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,(long)(int)m._76_4_);
    *pvVar1 = dVar2;
  }
  construct_matrix((TridiagonalMatrix *)local_b8,nx,nt);
  for (b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 1;
      b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ <= nt;
      b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    construct_rhs((vec *)local_d8,nx,nt,(vec *)local_30,
                  (double)b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_ * (1.0 / (double)nt),f,
                  exact_solution);
    cyclic_reduction((vec *)&error,(TridiagonalMatrix *)local_b8,(vec *)local_d8);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_30,
               (vector<double,_std::allocator<double>_> *)&error);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&error);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_d8);
  }
  dVar2 = compute_error((vec *)local_30,nx);
  TridiagonalMatrix::~TridiagonalMatrix((TridiagonalMatrix *)local_b8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return dVar2;
}

Assistant:

double solve_problem(int nx, int nt)
{
	int size = compute_linear_system_size(nx - 1);
	vec current_layer(size, 0.0);
	double h = X / nx;
	double tau = T / nt;

	for (int i = 0; i < nx - 1; i++)
	{
		current_layer[i] = exact_solution(h * (i + 1), 0.0);
	}

	TridiagonalMatrix m = construct_matrix(nx, nt);
	for (int i = 1; i <= nt; i++)
	{
		vec b = construct_rhs(nx, nt, current_layer, i * tau,
			f, exact_solution);
		current_layer = cyclic_reduction(m, b);
	}

	double error = compute_error(current_layer, nx);

	return error;
}